

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

uint32_t crc32_update(uint32_t crc,ptrlen data)

{
  uint32_t v;
  size_t sVar1;
  
  for (sVar1 = 0; data.len != sVar1; sVar1 = sVar1 + 1) {
    v = crc32_shift_4(crc ^ *(byte *)((long)data.ptr + sVar1));
    crc = crc32_shift_4(v);
  }
  return crc;
}

Assistant:

uint32_t crc32_update(uint32_t crc, ptrlen data)
{
    const uint8_t *p = (const uint8_t *)data.ptr;
    for (size_t len = data.len; len-- > 0 ;)
        crc = crc32_shift_8(crc ^ *p++);
    return crc;
}